

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

bool __thiscall
clipp::parser::try_match_joined_sequence<clipp::detail::select_all>
          (parser *this,arg_string *arg,select_all *acceptFirst)

{
  allocator<clipp::detail::match_t> *this_00;
  initializer_list<clipp::detail::match_t> __l;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  scoped_dfs_traverser *psVar6;
  pattern *ppVar7;
  pointer pmVar8;
  parameter *this_01;
  ulong uVar9;
  reference match_00;
  subrange sVar10;
  match_t *local_3b8;
  match_t *m;
  iterator __end2;
  iterator __begin2;
  vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *__range2;
  undefined1 local_348 [8];
  subrange match;
  match_t local_328;
  iterator local_268;
  size_type local_260;
  undefined1 local_258 [8];
  vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> matches;
  group *parent;
  scoped_dfs_traverser pos;
  scoped_dfs_traverser local_188;
  undefined1 local_e8 [8];
  match_t fstMatch;
  select_all *acceptFirst_local;
  arg_string *arg_local;
  parser *this_local;
  
  fstMatch.pos_._152_8_ = acceptFirst;
  detail::scoped_dfs_traverser::scoped_dfs_traverser(&local_188,&this->pos_);
  detail::longest_prefix_match<clipp::detail::select_all>
            ((match_t *)local_e8,&local_188,arg,(select_all *)fstMatch.pos_._152_8_);
  detail::scoped_dfs_traverser::~scoped_dfs_traverser(&local_188);
  bVar1 = detail::match_t::operator_cast_to_bool((match_t *)local_e8);
  if (bVar1) {
    detail::match_t::str_abi_cxx11_((match_t *)local_e8);
    lVar4 = std::__cxx11::string::size();
    lVar5 = std::__cxx11::string::size();
    if (lVar4 == lVar5) {
      add_match(this,(match_t *)local_e8);
      this_local._7_1_ = true;
      pos.ignoreBlocks_ = true;
      pos.repeatGroupStarted_ = false;
      pos.repeatGroupContinues_ = false;
      pos._155_1_ = 0;
    }
    else {
      psVar6 = detail::match_t::pos((match_t *)local_e8);
      ppVar7 = detail::scoped_dfs_traverser::operator->(psVar6);
      bVar1 = group::child_t<clipp::parameter,_clipp::group>::blocking(ppVar7);
      if (bVar1) {
        psVar6 = detail::match_t::pos((match_t *)local_e8);
        detail::scoped_dfs_traverser::scoped_dfs_traverser((scoped_dfs_traverser *)&parent,psVar6);
        detail::scoped_dfs_traverser::ignore_blocking((scoped_dfs_traverser *)&parent,true);
        matches.super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)detail::scoped_dfs_traverser::parent((scoped_dfs_traverser *)&parent);
        ppVar7 = detail::scoped_dfs_traverser::operator->((scoped_dfs_traverser *)&parent);
        bVar1 = group::child_t<clipp::parameter,_clipp::group>::repeatable(ppVar7);
        if (!bVar1) {
          detail::scoped_dfs_traverser::operator++((scoped_dfs_traverser *)&parent);
        }
        detail::match_t::str_abi_cxx11_((match_t *)local_e8);
        std::__cxx11::string::size();
        std::__cxx11::string::erase((ulong)arg,0);
        detail::match_t::match_t(&local_328,(match_t *)local_e8);
        local_268 = &local_328;
        local_260 = 1;
        this_00 = (allocator<clipp::detail::match_t> *)((long)&match.length_ + 7);
        std::allocator<clipp::detail::match_t>::allocator(this_00);
        __l._M_len = local_260;
        __l._M_array = local_268;
        std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::vector
                  ((vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *)
                   local_258,__l,this_00);
        std::allocator<clipp::detail::match_t>::~allocator
                  ((allocator<clipp::detail::match_t> *)((long)&match.length_ + 7));
        local_3b8 = (match_t *)&local_268;
        do {
          local_3b8 = local_3b8 + -1;
          detail::match_t::~match_t(local_3b8);
        } while (local_3b8 != &local_328);
        while( true ) {
          while( true ) {
            uVar3 = std::__cxx11::string::empty();
            bVar1 = false;
            if ((uVar3 & 1) == 0) {
              bVar2 = detail::scoped_dfs_traverser::operator_cast_to_bool
                                ((scoped_dfs_traverser *)&parent);
              bVar1 = false;
              if (bVar2) {
                ppVar7 = detail::scoped_dfs_traverser::operator->((scoped_dfs_traverser *)&parent);
                bVar2 = group::child_t<clipp::parameter,_clipp::group>::blocking(ppVar7);
                bVar1 = false;
                if (bVar2) {
                  ppVar7 = detail::scoped_dfs_traverser::operator->((scoped_dfs_traverser *)&parent)
                  ;
                  bVar2 = group::child_t<clipp::parameter,_clipp::group>::is_param(ppVar7);
                  bVar1 = false;
                  if (bVar2) {
                    pmVar8 = (pointer)detail::scoped_dfs_traverser::parent
                                                ((scoped_dfs_traverser *)&parent);
                    bVar1 = pmVar8 == matches.
                                      super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  }
                }
              }
            }
            if (!bVar1) {
              uVar9 = std::__cxx11::string::empty();
              if (((uVar9 & 1) == 0) ||
                 (bVar1 = std::
                          vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::
                          empty((vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>
                                 *)local_258), bVar1)) {
                this_local._7_1_ = false;
              }
              else {
                __end2 = std::
                         vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::
                         begin((vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>
                                *)local_258);
                m = (match_t *)
                    std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::
                    end((vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *)
                        local_258);
                while (bVar1 = __gnu_cxx::operator!=
                                         (&__end2,(
                                                  __normal_iterator<clipp::detail::match_t_*,_std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>_>
                                                  *)&m), bVar1) {
                  match_00 = __gnu_cxx::
                             __normal_iterator<clipp::detail::match_t_*,_std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>_>
                             ::operator*(&__end2);
                  add_match(this,match_00);
                  __gnu_cxx::
                  __normal_iterator<clipp::detail::match_t_*,_std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>_>
                  ::operator++(&__end2);
                }
                this_local._7_1_ = true;
              }
              goto LAB_00114eed;
            }
            ppVar7 = detail::scoped_dfs_traverser::operator->((scoped_dfs_traverser *)&parent);
            this_01 = group::child_t<clipp::parameter,_clipp::group>::as_param(ppVar7);
            sVar10 = parameter::match(this_01,arg);
            match.at_ = sVar10.length_;
            local_348 = (undefined1  [8])sVar10.at_;
            bVar1 = subrange::prefix((subrange *)local_348);
            if (!bVar1) break;
            subrange::length((subrange *)local_348);
            std::__cxx11::string::substr((ulong)&__range2,(ulong)arg);
            std::vector<clipp::detail::match_t,std::allocator<clipp::detail::match_t>>::
            emplace_back<std::__cxx11::string,clipp::detail::scoped_dfs_traverser&>
                      ((vector<clipp::detail::match_t,std::allocator<clipp::detail::match_t>> *)
                       local_258,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range2,(scoped_dfs_traverser *)&parent);
            std::__cxx11::string::~string((string *)&__range2);
            subrange::length((subrange *)local_348);
            std::__cxx11::string::erase((ulong)arg,0);
            ppVar7 = detail::scoped_dfs_traverser::operator->((scoped_dfs_traverser *)&parent);
            bVar1 = group::child_t<clipp::parameter,_clipp::group>::repeatable(ppVar7);
            if (!bVar1) {
              detail::scoped_dfs_traverser::operator++((scoped_dfs_traverser *)&parent);
            }
          }
          ppVar7 = detail::scoped_dfs_traverser::operator->((scoped_dfs_traverser *)&parent);
          bVar1 = group::child_t<clipp::parameter,_clipp::group>::repeatable(ppVar7);
          if (!bVar1) break;
          detail::scoped_dfs_traverser::operator++((scoped_dfs_traverser *)&parent);
        }
        this_local._7_1_ = false;
LAB_00114eed:
        pos.ignoreBlocks_ = true;
        pos.repeatGroupStarted_ = false;
        pos.repeatGroupContinues_ = false;
        pos._155_1_ = 0;
        std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::~vector
                  ((vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *)
                   local_258);
        detail::scoped_dfs_traverser::~scoped_dfs_traverser((scoped_dfs_traverser *)&parent);
      }
      else {
        this_local._7_1_ = false;
        pos.ignoreBlocks_ = true;
        pos.repeatGroupStarted_ = false;
        pos.repeatGroupContinues_ = false;
        pos._155_1_ = 0;
      }
    }
  }
  else {
    this_local._7_1_ = false;
    pos.ignoreBlocks_ = true;
    pos.repeatGroupStarted_ = false;
    pos.repeatGroupContinues_ = false;
    pos._155_1_ = 0;
  }
  detail::match_t::~match_t((match_t *)local_e8);
  return this_local._7_1_;
}

Assistant:

bool try_match_joined_sequence(arg_string arg,
                                   const ParamSelector& acceptFirst)
    {
        auto fstMatch = detail::longest_prefix_match(pos_, arg, acceptFirst);

        if(!fstMatch) return false;

        if(fstMatch.str().size() == arg.size()) {
            add_match(fstMatch);
            return true;
        }

        if(!fstMatch.pos()->blocking()) return false;

        auto pos = fstMatch.pos();
        pos.ignore_blocking(true);
        const auto parent = &pos.parent();
        if(!pos->repeatable()) ++pos;

        arg.erase(0, fstMatch.str().size());
        std::vector<match_t> matches { std::move(fstMatch) };

        while(!arg.empty() && pos &&
              pos->blocking() && pos->is_param() &&
              (&pos.parent() == parent))
        {
            auto match = pos->as_param().match(arg);

            if(match.prefix()) {
                matches.emplace_back(arg.substr(0,match.length()), pos);
                arg.erase(0, match.length());
                if(!pos->repeatable()) ++pos;
            }
            else {
                if(!pos->repeatable()) return false;
                ++pos;
            }

        }
        //if arg not fully covered => discard temporary matches
        if(!arg.empty() || matches.empty()) return false;

        for(const auto& m : matches) add_match(m);
        return true;
    }